

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::CharSetFull::ToEquivClass<unsigned_int>
          (CharSetFull *this,ArenaAllocator *allocator,uint level,uint base,uint *tblidx,
          CharSet<unsigned_int> *result,codepoint_t baseOffset)

{
  Char c;
  Char hc;
  uint h;
  int i;
  long lVar1;
  uint l;
  int n;
  codepoint_t local_58 [2];
  uint equivl [4];
  uint local_34 [2];
  uint acth;
  
  l = baseOffset + 0xff + base;
  if (level != 2) {
    l = baseOffset + base;
  }
  h = ~(-1 << ((char)level * '\x04' + 8U & 0x1f)) + baseOffset + base;
  do {
    CaseInsensitive::RangeToEquivClass(tblidx,l,h,local_34,local_58);
    n = local_34[0] - l;
    for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
      c = local_58[lVar1];
      hc = Chars<unsigned_int>::Shift(c,n);
      CharSet<unsigned_int>::SetRange(result,allocator,c,hc);
    }
    l = local_34[0] + 1;
  } while (l <= h);
  return;
}

Assistant:

void CharSetFull::ToEquivClass(ArenaAllocator* allocator, uint level, uint base, uint& tblidx, CharSet<C>& result, codepoint_t baseOffset) const
    {
        uint l = base + (CharSetNode::levels - 1 == level ? 0xff : 0) + baseOffset;
        uint h = base + lim(level) + baseOffset;

        do
        {
            uint acth;
            C equivl[CaseInsensitive::EquivClassSize];
            CaseInsensitive::RangeToEquivClass(tblidx, l, h, acth, equivl);
            uint n = acth - l;
            for (int i = 0; i < CaseInsensitive::EquivClassSize; i++)
            {
                result.SetRange(allocator, equivl[i], Chars<C>::Shift(equivl[i], n));
            }

            // Go around again for rest of this range
            l = acth + 1;
        }
        while (l <= h);
    }